

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O3

time_t cm_get_date(time_t now,char *p)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  int Count;
  int iVar8;
  uint uVar9;
  tm *ptVar10;
  ushort **ppuVar11;
  token *ptVar12;
  ulong uVar13;
  __int32_t **pp_Var14;
  ulong uVar15;
  size_t __n;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  time_t tVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  ulong *puVar23;
  char *__s;
  int iVar24;
  token *ptVar25;
  int iVar26;
  token *ptVar27;
  time_t *ptVar28;
  time_t tVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  bool bVar33;
  int local_1110;
  int local_110c;
  byte *local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  int local_10e0;
  int local_10dc;
  time_t local_10d8;
  ulong local_10d0;
  ulong local_10c8;
  ulong local_10c0;
  ulong local_10b8;
  int local_10b0;
  int local_10ac;
  int local_10a8;
  int local_10a4;
  time_t local_10a0;
  time_t local_1098;
  time_t now_local;
  long local_1088;
  tm *local_1080;
  char local_1078 [64];
  token tokens [256];
  
  now_local = now;
  memset(tokens,0,0x1000);
  local_10c8 = 0;
  local_10f0 = 0;
  local_10d0 = 0;
  ptVar10 = localtime(&now_local);
  if (ptVar10 == (tm *)0x0) {
    return -1;
  }
  iVar8 = ptVar10->tm_sec;
  iVar30 = ptVar10->tm_min;
  iVar24 = ptVar10->tm_hour;
  local_10a4 = ptVar10->tm_mday;
  local_10a8 = ptVar10->tm_mon;
  iVar22 = ptVar10->tm_year;
  iVar26 = ptVar10->tm_yday;
  iVar3 = ptVar10->tm_isdst;
  local_1080 = gmtime(&now_local);
  if (local_1080 == (tm *)0x0) {
    lVar21 = 0;
  }
  else {
    iVar31 = local_1080->tm_year + 0x76b;
    iVar5 = iVar31 / 100;
    iVar6 = (iVar22 + 0x76b) / 100;
    lVar21 = ((long)local_1080->tm_min - (long)iVar30) * 0x3c +
             ((long)local_1080->tm_sec - (long)iVar8) +
             ((long)local_1080->tm_hour - (long)iVar24) * 0xe10 +
             (long)(((iVar6 + local_1080->tm_yday) -
                    ((iVar6 >> 2) + iVar26 + (iVar22 + 0x76b >> 2) + iVar5)) +
                   (local_1080->tm_year - iVar22) * 0x16d + (iVar31 >> 2) + (iVar5 >> 2)) * 0x15180;
  }
  local_1088 = lVar21 + 0xe10;
  if (iVar3 == 0) {
    local_1088 = lVar21;
  }
  local_10dc = iVar24;
  local_10b0 = iVar30;
  local_10ac = iVar8;
  ppuVar11 = __ctype_b_loc();
  puVar4 = *ppuVar11;
  uVar17 = 0;
  do {
    ptVar12 = (token *)((long)&tokens[0].token + uVar17);
    while( true ) {
      bVar2 = *p;
      while (uVar15 = (ulong)bVar2, (*(byte *)((long)puVar4 + uVar15 * 2 + 1) & 0x20) != 0) {
        bVar2 = ((byte *)p)[1];
        p = (char *)((byte *)p + 1);
      }
      local_10e8 = uVar17;
      if (bVar2 != 0x28) break;
      iVar8 = 0;
      do {
        bVar2 = *p;
        if (bVar2 == 0x28) {
          iVar8 = iVar8 + 1;
        }
        else if (bVar2 == 0x29) {
          iVar8 = iVar8 + -1;
        }
        else if (bVar2 == 0) {
          ptVar12->token = 0;
          goto LAB_004241ab;
        }
        p = (char *)((byte *)p + 1);
      } while (0 < iVar8);
    }
    local_10f8 = (byte *)p;
    if (bVar2 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      do {
        cVar7 = (char)uVar15;
        uVar9 = (uint)uVar13;
        if ((puVar4[uVar15] & 8) == 0) {
          if ((cVar7 != '.') || (0x3e < uVar9)) break;
        }
        else {
          if (0x3e < uVar9) break;
          if (cVar7 != '.') {
            if ((puVar4[uVar15] >> 8 & 1) != 0) {
              pp_Var14 = __ctype_tolower_loc();
              cVar7 = (char)(*pp_Var14)[uVar15];
            }
            local_1078[uVar13] = cVar7;
            uVar13 = (ulong)(uVar9 + 1);
          }
        }
        pbVar1 = local_10f8 + 1;
        uVar15 = (ulong)*pbVar1;
        local_10f8 = local_10f8 + 1;
      } while (*pbVar1 != 0);
    }
    __s = "am";
    local_1078[uVar13] = '\0';
    __n = strlen(local_1078);
    ptVar28 = &TimeWords[0].value;
    do {
      sVar16 = ((LEXICON *)(ptVar28 + -3))->abbrev;
      if (sVar16 == 0) {
        sVar16 = strlen(__s);
      }
      if ((sVar16 <= __n) && (iVar8 = strncmp(__s,local_1078,__n), iVar8 == 0)) {
        *(time_t *)((long)&tokens[0].value + uVar17) = *ptVar28;
        iVar8 = *(int *)(ptVar28 + -1);
        p = (char *)local_10f8;
        goto LAB_00424121;
      }
      __s = (char *)ptVar28[2];
      ptVar28 = ptVar28 + 4;
    } while (__s != (char *)0x0);
    if ((*(byte *)((long)puVar4 + (ulong)(byte)*p * 2 + 1) & 8) == 0) {
      iVar8 = (int)*p;
      p = (char *)((byte *)p + 1);
LAB_00424121:
      ptVar12->token = iVar8;
      if (iVar8 == 0) {
LAB_004241ab:
        iVar8 = 0;
        if (local_10e8 == 0) {
          bVar33 = true;
          local_10e8 = 2;
          iVar26 = 0;
          iVar31 = 0;
          local_110c = 0;
          iVar24 = 0;
          local_10b8 = 0;
          local_10c0 = 0;
          local_10d8 = 0;
          local_10a0 = 0;
          local_1098 = 0;
          tVar29 = 0;
          lVar32 = 0;
          lVar21 = local_1088;
          iVar30 = local_10dc;
          goto LAB_00424a36;
        }
        lVar32 = 0;
        tVar29 = 0;
        local_1098 = 0;
        local_10a0 = 0;
        local_10e8 = 0;
        local_10d8 = 0;
        local_10c0 = 0;
        local_10b8 = 0;
        lVar21 = 0;
        iVar26 = 0;
        iVar24 = 0;
        local_110c = 0;
        local_10e0 = 0;
        iVar8 = 0;
        local_1110 = 0;
        ptVar27 = tokens;
        iVar30 = 0;
        break;
      }
    }
    else {
      *(undefined8 *)((long)&tokens[0].value + uVar17) = 0;
      uVar15 = (ulong)(byte)*p;
      if ((*(byte *)((long)puVar4 + uVar15 * 2 + 1) & 8) != 0) {
        lVar21 = 0;
        do {
          lVar21 = (long)(char)uVar15 + lVar21 * 10 + -0x30;
          *(long *)((long)&tokens[0].value + uVar17) = lVar21;
          uVar15 = (ulong)((byte *)p)[1];
          p = (char *)((byte *)p + 1);
        } while ((*(byte *)((long)puVar4 + uVar15 * 2 + 1) & 8) != 0);
      }
      ptVar12->token = 0x10b;
    }
    uVar17 = local_10e8 + 0x10;
    if (0xfe0 < local_10e8) {
      return -1;
    }
  } while( true );
  do {
    iVar3 = ptVar27->token;
    puVar23 = &local_10c8;
    iVar31 = iVar30;
    switch(iVar3) {
    case 0x105:
      iVar31 = iVar30 + 1;
      local_1098 = ptVar27->value;
      local_10a0 = 1;
      if (ptVar27[1].token == 0x2c) {
LAB_00424281:
        iVar31 = iVar30 + 1;
        ptVar25 = ptVar27 + 2;
      }
      else {
        ptVar25 = ptVar27 + 1;
      }
      break;
    case 0x106:
      iVar24 = iVar24 + 1;
      lVar21 = ptVar27->value;
      ptVar25 = ptVar27 + 1;
      local_10e8 = 0;
      break;
    case 0x107:
      goto LAB_00424aa2;
    case 0x108:
      if (ptVar27[1].token != 0x10b) {
        return -1;
      }
      if ((ptVar27[2].token == 0x2c) && (ptVar27[3].token == 0x10b)) {
        local_10f0 = ptVar27->value;
        local_10c8 = ptVar27[1].value;
        uVar17 = ptVar27[3].value;
        lVar18 = 0x40;
LAB_004243a7:
        local_1110 = local_1110 + 1;
        puVar23 = &local_10d0;
      }
      else {
        local_10f0 = ptVar27->value;
        uVar17 = ptVar27[1].value;
        lVar18 = 0x20;
      }
LAB_00424408:
      local_10e0 = local_10e0 + 1;
      iVar8 = iVar8 + 1;
      *puVar23 = uVar17;
      ptVar25 = (token *)((long)&ptVar27->token + lVar18);
      break;
    case 0x109:
      tVar29 = tVar29 + ptVar27->value;
      goto LAB_004243b1;
    case 0x10a:
      lVar32 = lVar32 + ptVar27->value;
LAB_004243b1:
      lVar18 = 0x10;
LAB_00424454:
      iVar26 = iVar26 + 1;
      ptVar25 = (token *)((long)&ptVar27->token + lVar18);
      if (*(int *)((long)&ptVar27->token + lVar18) == 0x104) {
        lVar32 = -lVar32;
        tVar29 = -tVar29;
        ptVar25 = ptVar25 + 1;
      }
      break;
    case 0x10b:
      iVar3 = ptVar27[1].token;
      if (0x104 < iVar3) {
        switch(iVar3) {
        case 0x105:
          local_10a0 = ptVar27->value;
          local_1098 = ptVar27[1].value;
          goto LAB_00424281;
        default:
          goto switchD_004242fe_caseD_106;
        case 0x107:
          local_10b8 = ptVar27->value;
          ptVar25 = ptVar27 + 1;
          local_10c0 = 0;
          local_10d8 = 0;
LAB_00424553:
          uVar17 = local_10b8 + 0xc;
          uVar15 = local_10b8;
          if (local_10b8 == 0xc) {
            uVar17 = local_10b8;
            uVar15 = 0;
          }
          local_10b8 = uVar17;
          if (ptVar25->value != 1) {
            local_10b8 = uVar15;
          }
          iVar30 = ptVar25[1].token;
          ptVar25 = ptVar25 + 1;
LAB_0042457c:
          local_110c = local_110c + 1;
          if (iVar30 == 0x2b) {
            if (ptVar25[1].token != 0x10b) goto LAB_0042446f;
            iVar24 = iVar24 + 1;
            lVar21 = ptVar25[1].value * -0x3c + (ptVar25[1].value / 100) * 0x960;
            iVar30 = ptVar25[2].token;
            ptVar25 = ptVar25 + 2;
            local_10e8 = 1;
          }
          if ((iVar30 == 0x2d) && (ptVar25[1].token == 0x10b)) {
            iVar24 = iVar24 + 1;
            lVar21 = ptVar25[1].value * 0x3c + (ptVar25[1].value / 100) * -0x960;
            ptVar25 = ptVar25 + 2;
            local_10e8 = 1;
          }
          goto LAB_0042446f;
        case 0x108:
          if (ptVar27[2].token == 0x10b) {
            local_10c8 = ptVar27->value;
            local_10f0 = ptVar27[1].value;
            uVar17 = ptVar27[2].value;
            lVar18 = 0x30;
            goto LAB_004243a7;
          }
          local_10c8 = ptVar27->value;
          uVar17 = ptVar27[1].value;
          lVar18 = 0x20;
          puVar23 = &local_10f0;
          goto LAB_00424408;
        case 0x109:
          tVar29 = tVar29 + ptVar27[1].value * ptVar27->value;
          break;
        case 0x10a:
          lVar32 = lVar32 + ptVar27[1].value * ptVar27->value;
        }
        lVar18 = 0x20;
        goto LAB_00424454;
      }
      if (iVar3 == 0x2d) {
        if (ptVar27[2].token == 0x108) {
          if ((ptVar27[3].token == 0x2d) && (ptVar27[4].token == 0x10b)) {
            uVar15 = ptVar27->value;
            local_10f0 = ptVar27[2].value;
            uVar17 = uVar15;
            local_10d0 = ptVar27[4].value;
            if (0x1f < (long)uVar15) {
              uVar17 = ptVar27[4].value;
              local_10d0 = uVar15;
            }
            goto LAB_0042476e;
          }
        }
        else if (((ptVar27[2].token == 0x10b) && (ptVar27[3].token == 0x2d)) &&
                (ptVar27[4].token == 0x10b)) {
          uVar17 = ptVar27->value;
          goto LAB_004246e7;
        }
      }
      else if (iVar3 == 0x2f) {
        if (ptVar27[2].token == 0x10b) {
          if ((ptVar27[3].token != 0x2f) || (ptVar27[4].token != 0x10b)) {
            local_10f0 = ptVar27->value;
            uVar17 = ptVar27[2].value;
            lVar18 = 0x30;
            goto LAB_00424408;
          }
          local_10f0 = ptVar27->value;
          uVar17 = local_10f0;
          if ((long)local_10f0 < 0xd) {
            local_10c8 = ptVar27[2].value;
            uVar17 = ptVar27[4].value;
            lVar18 = 0x50;
            goto LAB_004243a7;
          }
LAB_004246e7:
          local_10d0 = uVar17;
          local_10f0 = ptVar27[2].value;
          uVar17 = ptVar27[4].value;
LAB_0042476e:
          local_1110 = local_1110 + 1;
          lVar18 = 0x50;
          goto LAB_00424408;
        }
      }
      else if ((iVar3 == 0x3a) && (ptVar27[2].token == 0x10b)) {
        ptVar25 = ptVar27 + 3;
        iVar30 = ptVar27[3].token;
        if (iVar30 == 0x3a) {
          if (ptVar27[4].token != 0x10b) {
            local_10b8 = ptVar27->value;
            local_10c0 = ptVar27[2].value;
            local_110c = local_110c + 1;
            local_10d8 = 0;
            break;
          }
          local_10d8 = ptVar27[4].value;
          ptVar25 = ptVar27 + 5;
          iVar30 = ptVar27[5].token;
        }
        else {
          local_10d8 = 0;
        }
        local_10b8 = ptVar27->value;
        local_10c0 = ptVar27[2].value;
        if (iVar30 == 0x107) goto LAB_00424553;
        goto LAB_0042457c;
      }
switchD_004242fe_caseD_106:
      uVar17 = ptVar27->value;
      if ((local_1110 == 0 && iVar26 == 0) && local_110c != 0) {
        ptVar25 = ptVar27 + 1;
        iVar26 = 0;
        local_1110 = 1;
        local_10d0 = uVar17;
      }
      else if ((long)uVar17 < 0x2711) {
        if ((long)uVar17 < 0x18) {
          local_110c = local_110c + 1;
          local_10c0 = 0;
          local_10b8 = uVar17;
        }
        else {
          if (0x95f < uVar17) {
            return -1;
          }
          uVar9 = (uint)((uVar17 & 0xffff) >> 2) / 0x19;
          uVar20 = (int)uVar17 + uVar9 * -100;
          if (0x3b < (ushort)uVar20) {
            return -1;
          }
          local_10b8 = (ulong)uVar9;
          local_10c0 = (ulong)(uVar20 & 0xffff);
        }
        ptVar25 = ptVar27 + 1;
        local_10d8 = 0;
      }
      else {
        local_1110 = local_1110 + 1;
        iVar8 = iVar8 + 1;
        local_10e0 = local_10e0 + 1;
        local_10c8 = uVar17 % 100;
        local_10f0 = (uVar17 / 100) % 100;
        local_10d0 = uVar17 / 10000;
        ptVar25 = ptVar27 + 1;
      }
      break;
    case 0x10c:
      ptVar25 = ptVar27 + 1;
      local_10e8 = (ulong)(ptVar27[1].token != 0x10d);
      iVar24 = iVar24 + 1;
      lVar21 = ptVar27->value;
      break;
    default:
      if (iVar3 == 0x2b) {
        if (ptVar27[1].token != 0x10b) {
          return -1;
        }
        if (ptVar27[2].token == 0x109) {
          tVar29 = tVar29 + ptVar27[2].value * ptVar27[1].value;
        }
        else {
          if (ptVar27[2].token != 0x10a) {
            return -1;
          }
          lVar32 = lVar32 + ptVar27[2].value * ptVar27[1].value;
        }
      }
      else {
        if (iVar3 != 0x2d) {
          return -1;
        }
        if (ptVar27[1].token != 0x10b) {
          return -1;
        }
        if (ptVar27[2].token == 0x109) {
          tVar29 = tVar29 - ptVar27[2].value * ptVar27[1].value;
        }
        else {
          if (ptVar27[2].token != 0x10a) {
            return -1;
          }
          lVar32 = lVar32 - ptVar27[2].value * ptVar27[1].value;
        }
      }
      lVar18 = 0x30;
      goto LAB_00424454;
    }
LAB_0042446f:
    ptVar27 = ptVar25;
    iVar30 = iVar31;
  } while (ptVar25 < ptVar12);
  bVar33 = iVar26 == 0;
  iVar30 = local_10dc;
  if (iVar24 == 0) {
    local_10e8 = 2;
    iVar24 = 0;
    lVar21 = local_1088;
  }
  else if (local_1080 != (tm *)0x0) {
    now_local = now_local - lVar21;
    ptVar10 = gmtime(&now_local);
    iVar30 = local_10dc;
    if (ptVar10 != (tm *)0x0) {
      local_10ac = ptVar10->tm_sec;
      local_10b0 = ptVar10->tm_min;
      iVar30 = ptVar10->tm_hour;
      local_10a4 = ptVar10->tm_mday;
      local_10a8 = ptVar10->tm_mon;
      iVar22 = ptVar10->tm_year;
    }
    now_local = now_local + lVar21;
  }
  iVar26 = local_10e0;
  if (local_1110 == 0) {
LAB_00424a36:
    local_10d0 = (ulong)(iVar22 + 0x76c);
    local_1110 = 0;
  }
  if (iVar8 == 0) {
    local_10f0 = (ulong)(local_10a8 + 1);
  }
  if (iVar26 == 0) {
    local_10c8 = (ulong)local_10a4;
  }
  if ((iVar26 < 2 && iVar8 < 2) &&
      ((local_1110 < 2 && iVar31 < 2) && (iVar24 < 2 && local_110c < 2))) {
    if ((((iVar8 == 0 && local_1110 == 0) && iVar26 == 0) && iVar31 == 0) && local_110c == 0) {
      tVar19 = now_local;
      if (bVar33) {
        tVar19 = now_local + (long)iVar30 * -0xe10 + ((long)local_10b0 * -0x3c - (long)local_10ac);
      }
    }
    else {
      tVar19 = Convert(local_10f0,local_10c8,local_10d0,local_10b8,local_10c0,local_10d8,lVar21,
                       (DSTMODE)local_10e8);
      if (tVar19 < 0) {
        return -1;
      }
    }
    tVar29 = RelativeMonth(tVar19 + lVar32,lVar21,tVar29);
    lVar32 = tVar29 + tVar19 + lVar32;
    if ((iVar31 != 0) && ((iVar8 == 0 && local_1110 == 0) && iVar26 == 0)) {
      tVar29 = RelativeDate(lVar32,lVar21,(int)local_10e8,local_10a0,local_1098);
      lVar32 = lVar32 + tVar29;
    }
    if (lVar32 != -1) {
      return lVar32;
    }
    return 0;
  }
LAB_00424aa2:
  return -1;
}

Assistant:

time_t
__archive_get_date(time_t now, const char *p)
{
	struct token	tokens[256];
	struct gdstate	_gds;
	struct token	*lasttoken;
	struct gdstate	*gds;
	struct tm	local, *tm;
	struct tm	gmt, *gmt_ptr;
	time_t		Start;
	time_t		tod;
	long		tzone;

	/* Clear out the parsed token array. */
	memset(tokens, 0, sizeof(tokens));
	/* Initialize the parser state. */
	memset(&_gds, 0, sizeof(_gds));
	gds = &_gds;

	/* Look up the current time. */
	memset(&local, 0, sizeof(local));
	tm = localtime (&now);
	if (tm == NULL)
		return -1;
	local = *tm;

	/* Look up UTC if we can and use that to determine the current
	 * timezone offset. */
	memset(&gmt, 0, sizeof(gmt));
	gmt_ptr = gmtime (&now);
	if (gmt_ptr != NULL) {
		/* Copy, in case localtime and gmtime use the same buffer. */
		gmt = *gmt_ptr;
	}
	if (gmt_ptr != NULL)
		tzone = difftm (&gmt, &local);
	else
		/* This system doesn't understand timezones; fake it. */
		tzone = 0;
	if(local.tm_isdst)
		tzone += HOUR;

	/* Tokenize the input string. */
	lasttoken = tokens;
	while ((lasttoken->token = nexttoken(&p, &lasttoken->value)) != 0) {
		++lasttoken;
		if (lasttoken > tokens + 255)
			return -1;
	}
	gds->tokenp = tokens;

	/* Match phrases until we run out of input tokens. */
	while (gds->tokenp < lasttoken) {
		if (!phrase(gds))
			return -1;
	}

	/* Use current local timezone if none was specified. */
	if (!gds->HaveZone) {
		gds->Timezone = tzone;
		gds->DSTmode = DSTmaybe;
	}

	/* If a timezone was specified, use that for generating the default
	 * time components instead of the local timezone. */
	if (gds->HaveZone && gmt_ptr != NULL) {
		now -= gds->Timezone;
		gmt_ptr = gmtime (&now);
		if (gmt_ptr != NULL)
			local = *gmt_ptr;
		now += gds->Timezone;
	}

	if (!gds->HaveYear)
		gds->Year = local.tm_year + 1900;
	if (!gds->HaveMonth)
		gds->Month = local.tm_mon + 1;
	if (!gds->HaveDay)
		gds->Day = local.tm_mday;
	/* Note: No default for hour/min/sec; a specifier that just
	 * gives date always refers to 00:00 on that date. */

	/* If we saw more than one time, timezone, weekday, year, month,
	 * or day, then give up. */
	if (gds->HaveTime > 1 || gds->HaveZone > 1 || gds->HaveWeekDay > 1
	    || gds->HaveYear > 1 || gds->HaveMonth > 1 || gds->HaveDay > 1)
		return -1;

	/* Compute an absolute time based on whatever absolute information
	 * we collected. */
	if (gds->HaveYear || gds->HaveMonth || gds->HaveDay
	    || gds->HaveTime || gds->HaveWeekDay) {
		Start = Convert(gds->Month, gds->Day, gds->Year,
		    gds->Hour, gds->Minutes, gds->Seconds,
		    gds->Timezone, gds->DSTmode);
		if (Start < 0)
			return -1;
	} else {
		Start = now;
		if (!gds->HaveRel)
			Start -= local.tm_hour * HOUR + local.tm_min * MINUTE
			    + local.tm_sec;
	}

	/* Add the relative offset. */
	Start += gds->RelSeconds;
	Start += RelativeMonth(Start, gds->Timezone, gds->RelMonth);

	/* Adjust for day-of-week offsets. */
	if (gds->HaveWeekDay
	    && !(gds->HaveYear || gds->HaveMonth || gds->HaveDay)) {
		tod = RelativeDate(Start, gds->Timezone,
		    gds->DSTmode, gds->DayOrdinal, gds->DayNumber);
		Start += tod;
	}

	/* -1 is an error indicator, so return 0 instead of -1 if
	 * that's the actual time. */
	return Start == -1 ? 0 : Start;
}